

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_points_tree_decoder.cc
# Opt level: O0

bool __thiscall
draco::FloatPointsTreeDecoder::DecodePointCloudKdTreeInternal
          (FloatPointsTreeDecoder *this,DecoderBuffer *buffer,
          vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
          *qpoints)

{
  bool bVar1;
  size_type sVar2;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_> *in_RDX
  ;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_> *in_RDI
  ;
  DynamicIntegerPointsKdTreeDecoder<6> qpoints_decoder_6;
  DynamicIntegerPointsKdTreeDecoder<5> qpoints_decoder_5;
  DynamicIntegerPointsKdTreeDecoder<4> qpoints_decoder_4;
  DynamicIntegerPointsKdTreeDecoder<3> qpoints_decoder_3;
  DynamicIntegerPointsKdTreeDecoder<2> qpoints_decoder_2;
  DynamicIntegerPointsKdTreeDecoder<1> qpoints_decoder_1;
  DynamicIntegerPointsKdTreeDecoder<0> qpoints_decoder;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  oit;
  back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
  oit_qpoints;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  *in_stack_ffffffffffffef48;
  DynamicIntegerPointsKdTreeDecoder<4> *in_stack_ffffffffffffef50;
  DynamicIntegerPointsKdTreeDecoder<6> *this_00;
  DecoderBuffer *in_stack_ffffffffffffef58;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *in_stack_ffffffffffffef60;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *oit_00;
  DecoderBuffer *in_stack_ffffffffffffef68;
  DecoderBuffer *buffer_00;
  DynamicIntegerPointsKdTreeDecoder<4> *in_stack_ffffffffffffef70;
  DynamicIntegerPointsKdTreeDecoder<2> *this_01;
  size_type in_stack_ffffffffffffef88;
  uint32_t in_stack_fffffffffffff04c;
  DynamicIntegerPointsKdTreeDecoder<4> *in_stack_fffffffffffff050;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  local_868 [128];
  DecoderBuffer local_468 [4];
  DynamicIntegerPointsKdTreeDecoder<2> local_368 [3];
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  *local_38;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  local_30;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  *local_28;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  bVar1 = DecoderBuffer::Decode<unsigned_int>
                    (in_stack_ffffffffffffef58,&in_stack_ffffffffffffef50->bit_length_);
  if (bVar1) {
    if (*(uint *)&(in_RDI->
                  super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                  )._M_impl.super__Vector_impl_data._M_start < 0x20) {
      bVar1 = DecoderBuffer::Decode<float>
                        (in_stack_ffffffffffffef58,(float *)in_stack_ffffffffffffef50);
      if (bVar1) {
        bVar1 = DecoderBuffer::Decode<unsigned_int>
                          (in_stack_ffffffffffffef58,&in_stack_ffffffffffffef50->bit_length_);
        if (bVar1) {
          if ((*(int *)((long)&(in_RDI->
                               super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                               )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 0) ||
             (*(int *)((long)&(in_RDI->
                              super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish + 4) ==
              *(int *)((long)&(in_RDI->
                              super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + 4))) {
            bVar1 = DecoderBuffer::Decode<unsigned_int>
                              (in_stack_ffffffffffffef58,&in_stack_ffffffffffffef50->bit_length_);
            if (bVar1) {
              if (*(uint *)&(in_RDI->
                            super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage < 7) {
                local_38 = (vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                            *)std::
                              back_inserter<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>
                                        (in_stack_ffffffffffffef48);
                local_28 = local_38;
                ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
                ::ConversionOutputIterator
                          (&local_30,
                           (back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                            )local_38);
                if (*(int *)((long)&(in_RDI->
                                    super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + 4) != 0) {
                  std::
                  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                  ::reserve(in_RDI,in_stack_ffffffffffffef88);
                  switch(*(undefined4 *)
                          &(in_RDI->
                           super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                           )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  case 0:
                    DynamicIntegerPointsKdTreeDecoder<0>::DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<0> *)in_stack_fffffffffffff050,
                               in_stack_fffffffffffff04c);
                    DynamicIntegerPointsKdTreeDecoder<0>::
                    DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                              ((DynamicIntegerPointsKdTreeDecoder<0> *)in_stack_ffffffffffffef70,
                               in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
                    DynamicIntegerPointsKdTreeDecoder<0>::~DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<0> *)in_stack_ffffffffffffef50);
                    break;
                  case 1:
                    DynamicIntegerPointsKdTreeDecoder<1>::DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<1> *)in_stack_fffffffffffff050,
                               in_stack_fffffffffffff04c);
                    DynamicIntegerPointsKdTreeDecoder<1>::
                    DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                              ((DynamicIntegerPointsKdTreeDecoder<1> *)in_stack_ffffffffffffef70,
                               in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
                    DynamicIntegerPointsKdTreeDecoder<1>::~DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<1> *)in_stack_ffffffffffffef50);
                    break;
                  case 2:
                    this_01 = local_368;
                    DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<2> *)in_stack_fffffffffffff050,
                               in_stack_fffffffffffff04c);
                    DynamicIntegerPointsKdTreeDecoder<2>::
                    DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                              (this_01,in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
                    DynamicIntegerPointsKdTreeDecoder<2>::~DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<2> *)in_stack_ffffffffffffef50);
                    break;
                  case 3:
                    buffer_00 = local_468;
                    DynamicIntegerPointsKdTreeDecoder<3>::DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<3> *)in_stack_fffffffffffff050,
                               in_stack_fffffffffffff04c);
                    DynamicIntegerPointsKdTreeDecoder<3>::
                    DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                              ((DynamicIntegerPointsKdTreeDecoder<3> *)in_stack_ffffffffffffef70,
                               buffer_00,in_stack_ffffffffffffef60);
                    DynamicIntegerPointsKdTreeDecoder<3>::~DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<3> *)in_stack_ffffffffffffef50);
                    break;
                  case 4:
                    oit_00 = local_868;
                    DynamicIntegerPointsKdTreeDecoder<4>::DynamicIntegerPointsKdTreeDecoder
                              (in_stack_fffffffffffff050,in_stack_fffffffffffff04c);
                    DynamicIntegerPointsKdTreeDecoder<4>::
                    DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                              (in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,oit_00);
                    DynamicIntegerPointsKdTreeDecoder<4>::~DynamicIntegerPointsKdTreeDecoder
                              (in_stack_ffffffffffffef50);
                    break;
                  case 5:
                    DynamicIntegerPointsKdTreeDecoder<5>::DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<5> *)in_stack_fffffffffffff050,
                               in_stack_fffffffffffff04c);
                    DynamicIntegerPointsKdTreeDecoder<5>::
                    DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                              ((DynamicIntegerPointsKdTreeDecoder<5> *)in_stack_ffffffffffffef70,
                               in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
                    DynamicIntegerPointsKdTreeDecoder<5>::~DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<5> *)in_stack_ffffffffffffef50);
                    break;
                  case 6:
                    this_00 = (DynamicIntegerPointsKdTreeDecoder<6> *)&stack0xffffffffffffef98;
                    DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
                              ((DynamicIntegerPointsKdTreeDecoder<6> *)in_stack_fffffffffffff050,
                               in_stack_fffffffffffff04c);
                    DynamicIntegerPointsKdTreeDecoder<6>::
                    DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                              ((DynamicIntegerPointsKdTreeDecoder<6> *)in_stack_ffffffffffffef70,
                               in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
                    DynamicIntegerPointsKdTreeDecoder<6>::~DynamicIntegerPointsKdTreeDecoder
                              (this_00);
                    break;
                  default:
                    return false;
                  }
                }
                sVar2 = std::
                        vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                        ::size(local_20);
                if (sVar2 == *(uint *)((long)&(in_RDI->
                                              super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish + 4)) {
                  local_1 = true;
                }
                else {
                  local_1 = false;
                }
              }
              else {
                printf("FloatPointsTreeDecoder: compression level %i not supported.\n",
                       (ulong)*(uint *)&(in_RDI->
                                        super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                                        )._M_impl.super__Vector_impl_data._M_end_of_storage);
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FloatPointsTreeDecoder::DecodePointCloudKdTreeInternal(
    DecoderBuffer *buffer, std::vector<Point3ui> *qpoints) {
  if (!buffer->Decode(&qinfo_.quantization_bits)) {
    return false;
  }
  if (qinfo_.quantization_bits > 31) {
    return false;
  }
  if (!buffer->Decode(&qinfo_.range)) {
    return false;
  }
  if (!buffer->Decode(&num_points_)) {
    return false;
  }
  if (num_points_from_header_ > 0 && num_points_ != num_points_from_header_) {
    return false;
  }
  if (!buffer->Decode(&compression_level_)) {
    return false;
  }

  // Only allow compression level in [0..6].
  if (6 < compression_level_) {
    DRACO_LOGE("FloatPointsTreeDecoder: compression level %i not supported.\n",
               compression_level_);
    return false;
  }

  std::back_insert_iterator<std::vector<Point3ui>> oit_qpoints =
      std::back_inserter(*qpoints);
  ConversionOutputIterator<std::back_insert_iterator<std::vector<Point3ui>>,
                           Converter>
      oit(oit_qpoints);
  if (num_points_ > 0) {
    qpoints->reserve(num_points_);
    switch (compression_level_) {
      case 0: {
        DynamicIntegerPointsKdTreeDecoder<0> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 1: {
        DynamicIntegerPointsKdTreeDecoder<1> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 2: {
        DynamicIntegerPointsKdTreeDecoder<2> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 3: {
        DynamicIntegerPointsKdTreeDecoder<3> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 4: {
        DynamicIntegerPointsKdTreeDecoder<4> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 5: {
        DynamicIntegerPointsKdTreeDecoder<5> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 6: {
        DynamicIntegerPointsKdTreeDecoder<6> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      default:
        return false;
    }
  }

  if (qpoints->size() != num_points_) {
    return false;
  }
  return true;
}